

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O1

int arkInterpEvaluate_Lagrange
              (ARKodeMem_conflict ark_mem,ARKInterp I,sunrealtype tau,int deriv,int degree,
              N_Vector yout)

{
  double dVar1;
  uint uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  double *pdVar5;
  int iVar6;
  ulong uVar7;
  sunrealtype p;
  double t;
  N_Vector X [6];
  sunrealtype local_88 [6];
  undefined8 auStack_58 [7];
  
  pvVar3 = I->content;
  uVar2 = *(uint *)((long)pvVar3 + 0x18);
  iVar6 = 0;
  if (0 < degree) {
    iVar6 = degree;
  }
  if ((int)(uVar2 - 1) <= iVar6) {
    iVar6 = uVar2 - 1;
  }
  if (3 < (uint)deriv) {
    arkProcessError(ark_mem,-0x16,0x4ba,"arkInterpEvaluate_Lagrange",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_interp.c"
                    ,"Requested illegal derivative.");
    return -0x16;
  }
  if (iVar6 < deriv) {
    N_VConst(0,yout);
    return 0;
  }
  puVar4 = *(undefined8 **)((long)pvVar3 + 8);
  if (iVar6 == 0) {
    N_VScale(0x3ff0000000000000,*puVar4,yout);
    return 0;
  }
  pdVar5 = *(double **)((long)pvVar3 + 0x10);
  dVar1 = *pdVar5;
  t = tau * (dVar1 - pdVar5[1]) + dVar1;
  if (iVar6 != 1) {
    if (0 < (int)uVar2) {
      uVar7 = 0;
      do {
        local_88[uVar7] = 0.0;
        auStack_58[uVar7] = puVar4[uVar7];
        uVar7 = uVar7 + 1;
      } while (iVar6 + 1 != uVar7);
    }
    iVar6 = (*(code *)(&DAT_0017d62c + *(int *)(&DAT_0017d62c + (ulong)(uint)deriv * 4)))();
    return iVar6;
  }
  if (deriv == 0) {
    if ((int)uVar2 < 1) {
      local_88[0] = 1.0;
    }
    else {
      local_88[0] = 1.0;
      uVar7 = 0;
      do {
        if (uVar7 != 0) {
          local_88[0] = local_88[0] * ((t - pdVar5[uVar7]) / (dVar1 - pdVar5[uVar7]));
        }
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
      if (0 < (int)uVar2) {
        local_88[1] = 1.0;
        uVar7 = 0;
        do {
          if (uVar7 != 1) {
            local_88[1] = local_88[1] * ((t - pdVar5[uVar7]) / (pdVar5[1] - pdVar5[uVar7]));
          }
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
        goto LAB_0013d5f7;
      }
    }
    local_88[1] = 1.0;
  }
  else {
    local_88[0] = LBasisD(I,0,t);
    local_88[1] = LBasisD(I,1,t);
  }
LAB_0013d5f7:
  N_VLinearSum(local_88[0],*puVar4,puVar4[1],yout);
  return 0;
}

Assistant:

int arkInterpEvaluate_Lagrange(ARKodeMem ark_mem, ARKInterp I, sunrealtype tau,
                               int deriv, int degree, N_Vector yout)
{
  /* local variables */
  int q, retval, i, j;
  sunrealtype tval;
  sunrealtype a[6];
  N_Vector X[6];
  int nhist;
  sunrealtype* thist;
  N_Vector* yhist;

  /* set readability shortcuts */
  nhist = LINT_NHIST(I);
  thist = LINT_THIST(I);
  yhist = LINT_YHIST(I);

  /* determine polynomial degree q */
  q = SUNMAX(degree, 0);    /* respect lower bound */
  q = SUNMIN(q, nhist - 1); /* respect max possible */

  SUNLogDebug(ARK_LOGGER, "interp-eval",
              "tau = " SUN_FORMAT_G ", d = %i, q = %i", tau, deriv, q);

  /* error on illegal deriv */
  if ((deriv < 0) || (deriv > 3))
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Requested illegal derivative.");
    return (ARK_ILL_INPUT);
  }

  /* if deriv is too high, just return zeros */
  if (deriv > q)
  {
    N_VConst(ZERO, yout);
    return (ARK_SUCCESS);
  }

  /* if constant interpolant is requested, just return ynew */
  if (q == 0)
  {
    N_VScale(ONE, yhist[0], yout);
    return (ARK_SUCCESS);
  }

  /* convert from tau back to t (both tnew and told are valid since q>0 => NHIST>1) */
  tval = thist[0] + tau * (thist[0] - thist[1]);

  /* linear interpolant */
  if (q == 1)
  {
    if (deriv == 0)
    {
      a[0] = LBasis(I, 0, tval);
      a[1] = LBasis(I, 1, tval);
    }
    else
    { /* deriv == 1 */
      a[0] = LBasisD(I, 0, tval);
      a[1] = LBasisD(I, 1, tval);
    }
    N_VLinearSum(a[0], yhist[0], a[1], yhist[1], yout);
    return (ARK_SUCCESS);
  }

  /* higher-degree interpolant */
  /*    initialize arguments for N_VLinearCombination */
  for (i = 0; i < q + 1; i++)
  {
    a[i] = ZERO;
    X[i] = yhist[i];
  }

  /*    construct linear combination coefficients based on derivative requested */
  switch (deriv)
  {
  case (0): /* p(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasis(I, j, tval); }
    break;

  case (1): /* p'(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD(I, j, tval); }
    break;

  case (2): /* p''(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD2(I, j, tval); }
    break;

  case (3): /* p'''(t) */
    for (j = 0; j < q + 1; j++) { a[j] = LBasisD3(I, j, tval); }
    break;
  }

  /*    call N_VLinearCombination to evaluate the result, and return */
  retval = N_VLinearCombination(q + 1, a, X, yout);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  return (ARK_SUCCESS);
}